

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TemporaryObject.cpp
# Opt level: O0

void __thiscall
chatra::TemporaryObject::setFrameMethod
          (TemporaryObject *this,size_t frameIndex,Package *package,MethodTable *methodTable,
          Method *refMethod,Method *setMethod,bool hasArgs)

{
  bool hasArgs_local;
  Method *setMethod_local;
  Method *refMethod_local;
  MethodTable *methodTable_local;
  Package *package_local;
  size_t frameIndex_local;
  TemporaryObject *this_local;
  
  this->type = FrameMethod;
  clearTargetRef(this);
  this->frameIndex = frameIndex;
  this->package = package;
  this->methodTable = methodTable;
  this->method0 = refMethod;
  this->method1 = setMethod;
  this->methodHasArgs = hasArgs;
  clearRestrictions(this);
  return;
}

Assistant:

void TemporaryObject::setFrameMethod(size_t frameIndex, Package* package, const MethodTable* methodTable,
		const Method* refMethod, const Method* setMethod, bool hasArgs) {

	chatra_assert(methodTable != nullptr);
	chatra_assert(frameIndex == SIZE_MAX || (thread.frames[frameIndex].scope->getScopeType() != ScopeType::Thread &&
			thread.frames[frameIndex].scope->getScopeType() != ScopeType::Global &&
			thread.frames[frameIndex].scope->getScopeType() != ScopeType::Package));

	type = Type::FrameMethod;
	clearTargetRef();
	this->frameIndex = frameIndex;
	this->package = package;
	this->methodTable = methodTable;
	method0 = refMethod;
	method1 = setMethod;
	methodHasArgs = hasArgs;
	clearRestrictions();
}